

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_test.cc
# Opt level: O3

void __thiscall
test_libaom::AV1CornerMatch::AV1CornerMatchTest::RunSpeedTest(AV1CornerMatchTest *this)

{
  undefined8 *puVar1;
  ParamType *pPVar2;
  long lVar3;
  pointer *__ptr;
  int iVar4;
  uint uVar5;
  SEARCH_METHODS *pSVar6;
  double c_one_over_stddev1;
  double c_mean2;
  _Head_base<0UL,_unsigned_char_*,_false> local_c8;
  _Head_base<0UL,_unsigned_char_*,_false> local_c0;
  double c_mean1;
  undefined8 *local_b0;
  int local_a4;
  double c_one_over_stddev2;
  aom_usec_timer ref_timer;
  aom_usec_timer test_timer;
  double simd_one_over_stddev2;
  double simd_mean2;
  double simd_one_over_stddev1;
  double simd_mean1;
  
  local_c0._M_head_impl = (uchar *)operator_new__(0x100,(nothrow_t *)&std::nothrow);
  local_c8._M_head_impl = (uchar *)operator_new__(0x100,(nothrow_t *)&std::nothrow);
  c_one_over_stddev1 = 0.0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            ((internal *)&c_mean1,"input1","nullptr",
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_c0,
             (void **)&c_one_over_stddev1);
  puVar1 = local_b0;
  if (c_mean1._0_1_ == '\0') {
    testing::Message::Message((Message *)&c_one_over_stddev1);
    if (local_b0 == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = (SEARCH_METHODS *)*local_b0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c_mean2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
               ,0x94,(char *)pSVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&c_mean2,(Message *)&c_one_over_stddev1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c_mean2);
    if (c_one_over_stddev1 != 0.0) {
      (**(code **)(*(long *)c_one_over_stddev1 + 8))();
    }
    if (local_b0 == (undefined8 *)0x0) goto LAB_00405dcb;
    if ((undefined8 *)*local_b0 != local_b0 + 2) {
      operator_delete((undefined8 *)*local_b0);
    }
  }
  else {
    if (local_b0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_b0 != local_b0 + 2) {
        operator_delete((undefined8 *)*local_b0);
      }
      operator_delete(puVar1);
    }
    c_one_over_stddev1 = 0.0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              ((internal *)&c_mean1,"input2","nullptr",
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_c8,
               (void **)&c_one_over_stddev1);
    if (c_mean1._0_1_ != '\0') {
      if (local_b0 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_b0 != local_b0 + 2) {
          operator_delete((undefined8 *)*local_b0);
        }
        operator_delete(local_b0);
      }
      pPVar2 = testing::
               WithParamInterface<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
               ::GetParam();
      GenerateInput(this,local_c0._M_head_impl,local_c8._M_head_impl,0x10,0x10,
                    (pPVar2->
                    super__Tuple_impl<0UL,_int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>
                    ).super__Head_base<0UL,_int,_false>._M_head_impl);
      gettimeofday((timeval *)&ref_timer,(__timezone_ptr_t)0x0);
      iVar4 = 1000000;
      do {
        aom_compute_mean_stddev_c(local_c0._M_head_impl,0x10,0,0,&c_mean1,&c_one_over_stddev1);
        aom_compute_mean_stddev_c(local_c8._M_head_impl,0x10,0,0,&c_mean2,&c_one_over_stddev2);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      gettimeofday((timeval *)&ref_timer.end,(__timezone_ptr_t)0x0);
      lVar3 = ref_timer.end.tv_usec - ref_timer.begin.tv_usec;
      local_a4 = (int)lVar3 + 1000000;
      if (-1 < lVar3) {
        local_a4 = (int)lVar3;
      }
      local_a4 = local_a4 +
                 ((int)(lVar3 >> 0x3f) + ((int)ref_timer.end.tv_sec - (int)ref_timer.begin.tv_sec))
                 * 1000000;
      gettimeofday((timeval *)&test_timer,(__timezone_ptr_t)0x0);
      iVar4 = 1000000;
      do {
        (*this->target_compute_mean_stddev_func)
                  (local_c0._M_head_impl,0x10,0,0,&simd_mean1,&simd_one_over_stddev1);
        (*this->target_compute_mean_stddev_func)
                  (local_c8._M_head_impl,0x10,0,0,&simd_mean2,&simd_one_over_stddev2);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      gettimeofday((timeval *)&test_timer.end,(__timezone_ptr_t)0x0);
      lVar3 = test_timer.end.tv_usec - test_timer.begin.tv_usec;
      iVar4 = (int)lVar3 + 1000000;
      if (-1 < lVar3) {
        iVar4 = (int)lVar3;
      }
      printf("aom_compute_mean_stddev(): c_time=%6d   simd_time=%6d   gain=%.3f\n",
             (double)local_a4 /
             (double)(iVar4 + ((int)(lVar3 >> 0x3f) +
                              ((int)test_timer.end.tv_sec - (int)test_timer.begin.tv_sec)) * 1000000
                     ));
      gettimeofday((timeval *)&ref_timer,(__timezone_ptr_t)0x0);
      iVar4 = 1000000;
      do {
        aom_compute_correlation_c
                  (local_c0._M_head_impl,0x10,0,0,(double)CONCAT71(c_mean1._1_7_,c_mean1._0_1_),
                   c_one_over_stddev1,local_c8._M_head_impl,0x10,0,0,c_mean2,c_one_over_stddev2);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      gettimeofday((timeval *)&ref_timer.end,(__timezone_ptr_t)0x0);
      lVar3 = ref_timer.end.tv_usec - ref_timer.begin.tv_usec;
      iVar4 = (int)lVar3 + 1000000;
      if (-1 < lVar3) {
        iVar4 = (int)lVar3;
      }
      uVar5 = iVar4 + ((int)(lVar3 >> 0x3f) +
                      ((int)ref_timer.end.tv_sec - (int)ref_timer.begin.tv_sec)) * 1000000;
      gettimeofday((timeval *)&test_timer,(__timezone_ptr_t)0x0);
      iVar4 = 1000000;
      do {
        (*this->target_compute_corr_func)
                  (local_c0._M_head_impl,0x10,0,0,(double)CONCAT71(c_mean1._1_7_,c_mean1._0_1_),
                   c_one_over_stddev1,local_c8._M_head_impl,0x10,0,0,c_mean2,c_one_over_stddev2);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      gettimeofday((timeval *)&test_timer.end,(__timezone_ptr_t)0x0);
      lVar3 = test_timer.end.tv_usec - test_timer.begin.tv_usec;
      iVar4 = (int)lVar3 + 1000000;
      if (-1 < lVar3) {
        iVar4 = (int)lVar3;
      }
      printf("aom_compute_correlation(): c_time=%6d   simd_time=%6d   gain=%.3f\n",
             (double)(int)uVar5 /
             (double)(iVar4 + ((int)(lVar3 >> 0x3f) +
                              ((int)test_timer.end.tv_sec - (int)test_timer.begin.tv_sec)) * 1000000
                     ),(ulong)uVar5);
      goto LAB_00405dcb;
    }
    testing::Message::Message((Message *)&c_one_over_stddev1);
    if (local_b0 == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = (SEARCH_METHODS *)*local_b0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c_mean2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
               ,0x95,(char *)pSVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&c_mean2,(Message *)&c_one_over_stddev1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c_mean2);
    if (c_one_over_stddev1 != 0.0) {
      (**(code **)(*(long *)c_one_over_stddev1 + 8))();
    }
    if (local_b0 == (undefined8 *)0x0) goto LAB_00405dcb;
    if ((undefined8 *)*local_b0 != local_b0 + 2) {
      operator_delete((undefined8 *)*local_b0);
    }
  }
  operator_delete(local_b0);
LAB_00405dcb:
  if (local_c8._M_head_impl != (uint8_t *)0x0) {
    operator_delete__(local_c8._M_head_impl);
  }
  if (local_c0._M_head_impl != (uint8_t *)0x0) {
    operator_delete__(local_c0._M_head_impl);
  }
  return;
}

Assistant:

void AV1CornerMatchTest::RunSpeedTest() {
  const int w = 16, h = 16;
  const int num_iters = 1000000;
  aom_usec_timer ref_timer, test_timer;

  std::unique_ptr<uint8_t[]> input1(new (std::nothrow) uint8_t[w * h]);
  std::unique_ptr<uint8_t[]> input2(new (std::nothrow) uint8_t[w * h]);
  ASSERT_NE(input1, nullptr);
  ASSERT_NE(input2, nullptr);

  // Test the two extreme cases:
  // i) Random data, should have correlation close to 0
  // ii) Linearly related data + noise, should have correlation close to 1
  int mode = GET_PARAM(0);
  GenerateInput(&input1[0], &input2[0], w, h, mode);

  // Time aom_compute_mean_stddev()
  double c_mean1, c_one_over_stddev1, c_mean2, c_one_over_stddev2;
  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_iters; i++) {
    aom_compute_mean_stddev_c(input1.get(), w, 0, 0, &c_mean1,
                              &c_one_over_stddev1);
    aom_compute_mean_stddev_c(input2.get(), w, 0, 0, &c_mean2,
                              &c_one_over_stddev2);
  }
  aom_usec_timer_mark(&ref_timer);
  int elapsed_time_c = static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  double simd_mean1, simd_one_over_stddev1, simd_mean2, simd_one_over_stddev2;
  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_iters; i++) {
    target_compute_mean_stddev_func(input1.get(), w, 0, 0, &simd_mean1,
                                    &simd_one_over_stddev1);
    target_compute_mean_stddev_func(input2.get(), w, 0, 0, &simd_mean2,
                                    &simd_one_over_stddev2);
  }
  aom_usec_timer_mark(&test_timer);
  int elapsed_time_simd = static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf(
      "aom_compute_mean_stddev(): c_time=%6d   simd_time=%6d   "
      "gain=%.3f\n",
      elapsed_time_c, elapsed_time_simd,
      (elapsed_time_c / (double)elapsed_time_simd));

  // Time aom_compute_correlation
  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_iters; i++) {
    aom_compute_correlation_c(input1.get(), w, 0, 0, c_mean1,
                              c_one_over_stddev1, input2.get(), w, 0, 0,
                              c_mean2, c_one_over_stddev2);
  }
  aom_usec_timer_mark(&ref_timer);
  elapsed_time_c = static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_iters; i++) {
    target_compute_corr_func(input1.get(), w, 0, 0, c_mean1, c_one_over_stddev1,
                             input2.get(), w, 0, 0, c_mean2,
                             c_one_over_stddev2);
  }
  aom_usec_timer_mark(&test_timer);
  elapsed_time_simd = static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf(
      "aom_compute_correlation(): c_time=%6d   simd_time=%6d   "
      "gain=%.3f\n",
      elapsed_time_c, elapsed_time_simd,
      (elapsed_time_c / (double)elapsed_time_simd));
}